

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  ImVec2 cr_min;
  ImVec2 cr_max;
  ImVec2 cr_min_00;
  ImVec2 cr_max_00;
  long lVar5;
  ImDrawCmd *pIVar6;
  ImGuiWindow *pIVar7;
  int iVar8;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImVec2 local_88;
  ImVec2 IStack_80;
  undefined1 local_78 [12];
  float fStack_6c;
  ImTextureID local_68;
  undefined8 uStack_60;
  uint local_58;
  undefined4 uStack_54;
  ImDrawCallback p_Stack_50;
  void *local_48;
  ImRect local_40;
  
  if (0xffffff < col) {
    pIVar2 = window->Viewport;
    IStack_80.x = (pIVar2->super_ImGuiViewport).Pos.x + (pIVar2->super_ImGuiViewport).Size.x;
    IStack_80.y = (pIVar2->super_ImGuiViewport).Pos.y + (pIVar2->super_ImGuiViewport).Size.y;
    local_88.x = (pIVar2->super_ImGuiViewport).Pos.x;
    local_88.y = (pIVar2->super_ImGuiViewport).Pos.y;
    pIVar3 = window->RootWindowDockTree->DrawList;
    if ((pIVar3->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(pIVar3);
    }
    cr_min.y = local_88.y + -1.0;
    cr_min.x = local_88.x + -1.0;
    cr_max.y = IStack_80.y + 1.0;
    cr_max.x = IStack_80.x + 1.0;
    ImDrawList::PushClipRect(pIVar3,cr_min,cr_max,false);
    ImDrawList::AddRectFilled(pIVar3,&local_88,&IStack_80,col,0.0,0);
    lVar5 = (long)(pIVar3->CmdBuffer).Size;
    if (lVar5 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x758,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar6 = (pIVar3->CmdBuffer).Data;
    pIVar4 = pIVar6 + lVar5 + -1;
    local_78._0_4_ = (pIVar4->ClipRect).x;
    local_78._4_4_ = (pIVar4->ClipRect).y;
    local_78._8_4_ = (pIVar4->ClipRect).z;
    fStack_6c = (pIVar4->ClipRect).w;
    local_68 = pIVar6[lVar5 + -1].TextureId;
    uStack_60 = (&pIVar6[lVar5 + -1].TextureId)[1];
    pIVar4 = pIVar6 + lVar5 + -1;
    local_58 = pIVar4->ElemCount;
    uStack_54 = *(undefined4 *)&pIVar4->field_0x24;
    p_Stack_50 = *(ImDrawCallback *)(&pIVar4->ElemCount + 2);
    local_48 = pIVar6[lVar5 + -1].UserCallbackData;
    if (local_58 != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1350,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    iVar8 = (pIVar3->CmdBuffer).Size;
    if (iVar8 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x764,"void ImVector<ImDrawCmd>::pop_back() [T = ImDrawCmd]");
    }
    iVar8 = iVar8 + -1;
    (pIVar3->CmdBuffer).Size = iVar8;
    if (iVar8 == 0) {
      if ((pIVar3->CmdBuffer).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar6 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
        pIVar4 = (pIVar3->CmdBuffer).Data;
        if (pIVar4 != (ImDrawCmd *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(pIVar3->CmdBuffer).Size * 0x38);
          pIVar4 = (pIVar3->CmdBuffer).Data;
          if ((pIVar4 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (pIVar3->CmdBuffer).Data = pIVar6;
        (pIVar3->CmdBuffer).Capacity = 8;
      }
      pIVar4 = (pIVar3->CmdBuffer).Data;
      iVar8 = (pIVar3->CmdBuffer).Size;
      pIVar4[iVar8].UserCallbackData = local_48;
      pIVar6 = pIVar4 + iVar8;
      pIVar6->ElemCount = local_58;
      *(undefined4 *)&pIVar6->field_0x24 = uStack_54;
      *(ImDrawCallback *)(&pIVar6->ElemCount + 2) = p_Stack_50;
      pIVar4[iVar8].TextureId = local_68;
      (&pIVar4[iVar8].TextureId)[1] = (ImTextureID)uStack_60;
      pIVar4 = pIVar4 + iVar8;
      (pIVar4->ClipRect).x = (float)local_78._0_4_;
      (pIVar4->ClipRect).y = (float)local_78._4_4_;
      (pIVar4->ClipRect).z = (float)local_78._8_4_;
      (pIVar4->ClipRect).w = fStack_6c;
      (pIVar3->CmdBuffer).Size = (pIVar3->CmdBuffer).Size + 1;
    }
    else {
      ImVector<ImDrawCmd>::insert(&pIVar3->CmdBuffer,(pIVar3->CmdBuffer).Data,(ImDrawCmd *)local_78)
      ;
    }
    ImDrawList::PopClipRect(pIVar3);
    ImDrawList::AddDrawCmd(pIVar3);
    if ((window->RootWindow->field_0x3f9 & 1) != 0) {
      pIVar7 = FindFrontMostVisibleChildWindow(window->RootWindow);
      pIVar3 = pIVar7->DrawList;
      if ((pIVar3->CmdBuffer).Size == 0) {
        ImDrawList::AddDrawCmd(pIVar3);
      }
      cr_min_00.y = local_88.y;
      cr_min_00.x = local_88.x;
      cr_max_00.y = IStack_80.y;
      cr_max_00.x = IStack_80.x;
      ImDrawList::PushClipRect(pIVar3,cr_min_00,cr_max_00,false);
      pIVar7 = window->RootWindowDockTree;
      local_78._0_8_ = pIVar7->Pos;
      fStack_6c = (pIVar7->Pos).y + (pIVar7->Size).y;
      local_78._8_4_ = (pIVar7->Pos).x + (pIVar7->Size).x;
      pIVar7 = window->RootWindow;
      local_40.Max.x = (pIVar7->Pos).x + (pIVar7->Size).x;
      local_40.Max.y = (pIVar7->Pos).y + (pIVar7->Size).y;
      local_40.Min.x = (pIVar7->Pos).x;
      local_40.Min.y = (pIVar7->Pos).y;
      RenderRectFilledWithHole(pIVar3,(ImRect *)local_78,&local_40,col,0.0);
      ImDrawList::PopClipRect(pIVar3);
    }
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = window->Viewport;
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindowDockTree->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }

    // Draw over sibling docking nodes in a same docking tree
    if (window->RootWindow->DockIsActive)
    {
        ImDrawList* draw_list = FindFrontMostVisibleChildWindow(window->RootWindowDockTree)->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min, viewport_rect.Max, false);
        RenderRectFilledWithHole(draw_list, window->RootWindowDockTree->Rect(), window->RootWindow->Rect(), col, 0.0f);// window->RootWindowDockTree->WindowRounding);
        draw_list->PopClipRect();
    }
}